

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

Vector<float,_2,_true> __thiscall
Nova::Vector<float,_2,_true>::operator/(Vector<float,_2,_true> *this,Vector<float,_2,_true> *a)

{
  Vector<float,_2,_true> VVar1;
  long lVar2;
  long in_RDX;
  float fVar3;
  
  Vector(this,a);
  lVar2 = 0;
  do {
    fVar3 = *(float *)((long)(this->_data)._M_elems + lVar2) / *(float *)(in_RDX + lVar2);
    *(float *)((long)(this->_data)._M_elems + lVar2) = fVar3;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  VVar1._data._M_elems[1] = 0.0;
  VVar1._data._M_elems[0] = fVar3;
  return (Vector<float,_2,_true>)VVar1._data._M_elems;
}

Assistant:

Vector operator/(const Vector& a) const
    {
        Vector data_copy(*this);
        data_copy/=a;
        return data_copy; 
    }